

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void rw::Engine::stop(void)

{
  FILE *__stream;
  char *pcVar1;
  PluginList *this;
  uint i;
  long lVar2;
  Error _e;
  
  if ((engine == (void *)0x0) || (state != 3)) {
    _e.plugin = 0;
    _e.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/engine.cpp"
            ,0x167);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000001);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&_e);
  }
  else {
    this = (PluginList *)&Driver::s_plglist;
    for (lVar2 = 0; lVar2 != 0xd; lVar2 = lVar2 + 1) {
      PluginList::destruct(this,*(void **)((long)engine + lVar2 * 8 + 0x20));
      this = this + 1;
    }
    PluginList::destruct((PluginList *)&s_plglist,engine);
    (**(code **)((long)engine + 0x108))(1,0,0);
    state = 2;
  }
  return;
}

Assistant:

void
Engine::stop(void)
{
	if(engine == nil || Engine::state != Started){
		RWERROR((ERR_GENERAL));
		return;
	}

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		Driver::s_plglist[i].destruct(rw::engine->driver[i]);
	Engine::s_plglist.destruct(engine);

	engine->device.system(DEVICETERM, nil, 0);

	Engine::state = Opened;
}